

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QByteArray,QByteArray>::emplace<QByteArray_const&>
          (QHash<QByteArray,_QByteArray> *this,QByteArray *key,QByteArray *args)

{
  long lVar1;
  QByteArray *in_RDX;
  QHash<QByteArray,_QByteArray> *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  piter pVar2;
  QByteArray copy;
  QByteArray *in_stack_ffffffffffffff88;
  QByteArray *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::QByteArray(in_RDI,in_stack_ffffffffffffff88);
  pVar2 = (piter)emplace<QByteArray_const&>(in_RSI,in_RDX,in_stack_ffffffffffffffa8);
  QByteArray::~QByteArray((QByteArray *)0x163456);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)pVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        Key copy = key; // Needs to be explicit for MSVC 2019
        return emplace(std::move(copy), std::forward<Args>(args)...);
    }